

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O2

back_insert_iterator<std::vector<testing::Matcher<const_char_&>,_std::allocator<testing::Matcher<const_char_&>_>_>_>
 __thiscall
testing::internal::
TransformTupleValuesHelper<std::tuple<char,_char,_char,_char,_char,_char,_char>,_testing::internal::CastAndAppendTransform<const_char_&>,_std::back_insert_iterator<std::vector<testing::Matcher<const_char_&>,_std::allocator<testing::Matcher<const_char_&>_>_>_>_>
::IterateOverTuple<std::tuple<char,_char,_char,_char,_char,_char,_char>,_5UL>::operator()
          (undefined8 param_1,long param_2,
          vector<testing::Matcher<char_const&>,std::allocator<testing::Matcher<char_const&>>>
          *param_3)

{
  back_insert_iterator<std::vector<testing::Matcher<const_char_&>,_std::allocator<testing::Matcher<const_char_&>_>_>_>
  bVar1;
  MatcherBase<const_char_&> local_30;
  
  Matcher<const_char_&>::Matcher((Matcher<const_char_&> *)&local_30,(char *)(param_2 + 4));
  std::vector<testing::Matcher<char_const&>,std::allocator<testing::Matcher<char_const&>>>::
  emplace_back<testing::Matcher<char_const&>>(param_3,(Matcher<const_char_&> *)&local_30);
  MatcherBase<const_char_&>::~MatcherBase(&local_30);
  bVar1 = IterateOverTuple<std::tuple<char,_char,_char,_char,_char,_char,_char>,_4UL>::operator()
                    ((IterateOverTuple<std::tuple<char,_char,_char,_char,_char,_char,_char>,_4UL> *)
                     &local_30,param_2,param_3);
  return (back_insert_iterator<std::vector<testing::Matcher<const_char_&>,_std::allocator<testing::Matcher<const_char_&>_>_>_>
          )bVar1.container;
}

Assistant:

OutIter operator() (Func f, const Tup& t, OutIter out) const {
      *out++ = f(::std::get<TupleSize::value - kRemainingSize>(t));
      return IterateOverTuple<Tup, kRemainingSize - 1>()(f, t, out);
    }